

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.h
# Opt level: O0

bool __thiscall Assimp::LWS::NodeDesc::operator==(NodeDesc *this,uint num)

{
  bool local_29;
  uint _type;
  uint num_local;
  NodeDesc *this_local;
  
  if (num == 0) {
    this_local._7_1_ = false;
  }
  else {
    local_29 = false;
    if (num >> 0x1c == this->type) {
      local_29 = (num & 0xfffffff) == this->number;
    }
    this_local._7_1_ = local_29;
  }
  return this_local._7_1_;
}

Assistant:

bool operator == (unsigned int num)  const {
        if (!num)
            return false;
        unsigned int _type = num >> 28u;

        return _type == static_cast<unsigned int>(type) && (num & AI_LWS_MASK) == number;
    }